

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListView.cpp
# Opt level: O2

void __thiscall QColorListView::setSelectedColors(QColorListView *this,QList<QColor> *colorsList)

{
  QColorListModel *pQVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  int iVar5;
  QSet<QString> colors;
  QItemSelection selection;
  QForeachContainer<QList<QColor>_> _container_113;
  QModelIndex index;
  QString colorName;
  
  colors.q_hash.d = (Hash)(Data *)0x0;
  selection.super_QList<QItemSelectionRange>.d.d = (Data *)0x0;
  selection.super_QList<QItemSelectionRange>.d.ptr = (QItemSelectionRange *)0x0;
  selection.super_QList<QItemSelectionRange>.d.size = 0;
  QtPrivate::QForeachContainer<QList<QColor>_>::QForeachContainer(&_container_113,colorsList);
  for (; _container_113.i.i != _container_113.e.i; _container_113.i.i = _container_113.i.i + 1) {
    QColor::name((NameFormat)&index);
    QSet<QString>::operator<<(&colors,(QString *)&index);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&index);
  }
  QArrayDataPointer<QColor>::~QArrayDataPointer((QArrayDataPointer<QColor> *)&_container_113);
  iVar5 = 0;
  while( true ) {
    pQVar1 = this->d->model;
    _container_113.c.d.d = (Data *)0xffffffffffffffff;
    _container_113.c.d.ptr = (QColor *)0x0;
    _container_113.c.d.size = 0;
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&_container_113);
    if (iVar3 <= iVar5) break;
    pQVar1 = this->d->model;
    _container_113.c.d.d = (Data *)0xffffffffffffffff;
    _container_113.c.d.ptr = (QColor *)0x0;
    _container_113.c.d.size = 0;
    (**(code **)(*(long *)pQVar1 + 0x60))(&index,pQVar1,iVar5,0,&_container_113);
    QModelIndex::data((QVariant *)&_container_113,&index,0x100);
    QVariant::toString();
    QVariant::~QVariant((QVariant *)&_container_113);
    bVar2 = QHash<QString,_QHashDummyValue>::contains(&colors.q_hash,(QString *)&colorName.d);
    if (bVar2) {
      QItemSelection::select((QModelIndex *)&selection,&index);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&colorName.d);
    iVar5 = iVar5 + 1;
  }
  plVar4 = (long *)QAbstractItemView::selectionModel();
  (**(code **)(*plVar4 + 0x70))(plVar4,&selection,3);
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
            ((QArrayDataPointer<QItemSelectionRange> *)&selection);
  QHash<QString,_QHashDummyValue>::~QHash(&colors.q_hash);
  return;
}

Assistant:

void QColorListView::setSelectedColors(const QList<QColor> &colorsList) {
    QSet<QString> colors;
    QItemSelection selection;

    foreach (const QColor &color, colorsList) {
        colors << d->internalColorName(color);
    }

    for (int i = 0; i < d->model->rowCount(); i++) {
        const QModelIndex index = d->model->index(i, 0);
        const QString colorName = index.data(static_cast<int>(QColorListModel::Role::HexArgbName)).toString();

        if (colors.contains(colorName)) {
            selection.select(index, index);
        }
    }

    selectionModel()->select(selection, QItemSelectionModel::ClearAndSelect);
}